

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>
CreateChainParams(ArgsManager *args,ChainType chain)

{
  long lVar1;
  undefined4 in_EDX;
  __uniq_ptr_data<const_CChainParams,_std::default_delete<const_CChainParams>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  RegTestOptions opts_1;
  SigNetOptions opts;
  RegTestOptions *in_stack_fffffffffffffec8;
  SigNetOptions *in_stack_fffffffffffffed8;
  RegTestOptions *options;
  SigNetOptions *in_stack_ffffffffffffff68;
  ArgsManager *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0:
    CChainParams::Main();
    break;
  case 1:
    CChainParams::TestNet();
    break;
  case 2:
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffec8);
    std::
    optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffec8);
    ReadSigNetArgs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    CChainParams::SigNet(in_stack_fffffffffffffed8);
    CChainParams::SigNetOptions::~SigNetOptions((SigNetOptions *)in_stack_fffffffffffffec8);
    break;
  case 3:
    options = (RegTestOptions *)0x0;
    std::
    unordered_map<Consensus::DeploymentPos,_CChainParams::VersionBitsParameters,_std::hash<Consensus::DeploymentPos>,_std::equal_to<Consensus::DeploymentPos>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>_>
    ::unordered_map(&in_stack_fffffffffffffec8->version_bits_parameters);
    std::
    unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
    ::unordered_map((unordered_map<Consensus::BuriedDeployment,_int,_std::hash<Consensus::BuriedDeployment>,_std::equal_to<Consensus::BuriedDeployment>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>_>
                     *)in_stack_fffffffffffffec8);
    ReadRegTestArgs((ArgsManager *)opts_1.activation_heights._M_h._M_element_count,
                    (RegTestOptions *)opts_1.activation_heights._M_h._M_before_begin._M_nxt);
    CChainParams::RegTest(options);
    CChainParams::RegTestOptions::~RegTestOptions(in_stack_fffffffffffffec8);
    break;
  case 4:
    CChainParams::TestNet4();
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparams.cpp"
                  ,0x83,
                  "std::unique_ptr<const CChainParams> CreateChainParams(const ArgsManager &, const ChainType)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<const_CChainParams,_std::default_delete<const_CChainParams>,_true,_true>)
         (tuple<const_CChainParams_*,_std::default_delete<const_CChainParams>_>)
         in_RDI.super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>.
         _M_t.super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
         .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<const CChainParams> CreateChainParams(const ArgsManager& args, const ChainType chain)
{
    switch (chain) {
    case ChainType::MAIN:
        return CChainParams::Main();
    case ChainType::TESTNET:
        return CChainParams::TestNet();
    case ChainType::TESTNET4:
        return CChainParams::TestNet4();
    case ChainType::SIGNET: {
        auto opts = CChainParams::SigNetOptions{};
        ReadSigNetArgs(args, opts);
        return CChainParams::SigNet(opts);
    }
    case ChainType::REGTEST: {
        auto opts = CChainParams::RegTestOptions{};
        ReadRegTestArgs(args, opts);
        return CChainParams::RegTest(opts);
    }
    }
    assert(false);
}